

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

LValue * __thiscall
slang::ast::SimpleAssignmentPatternExpression::evalLValueImpl
          (LValue *__return_storage_ptr__,SimpleAssignmentPatternExpression *this,
          EvalContext *context)

{
  __index_type _Var1;
  size_t sVar2;
  pointer ppEVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pLVar6;
  char cVar7;
  bool bVar8;
  long lVar9;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> lvals;
  LValue lval;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> local_1d8;
  SimpleAssignmentPatternExpression *local_1c0;
  _Variadic_union<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat> local_1b8;
  char local_38;
  
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::reserve
            (&local_1d8,
             (this->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value);
  sVar2 = (this->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
  if (sVar2 != 0) {
    ppEVar3 = (this->super_AssignmentPatternExpressionBase).elements_._M_ptr;
    _Var1 = *(__index_type *)
             ((long)&(__return_storage_ptr__->value).
                     super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                     .
                     super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             + 0x180);
    lVar9 = 0;
    local_1c0 = this;
    do {
      Expression::evalLValue
                ((LValue *)&local_1b8,*(Expression **)(*(long *)((long)ppEVar3 + lVar9) + 0x40),
                 context);
      cVar7 = local_38;
      if (local_38 == '\0') {
        _Var1 = '\0';
      }
      else {
        std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::
        emplace_back<slang::ast::LValue>(&local_1d8,(LValue *)&local_1b8);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           *)&local_1b8);
      if (cVar7 == '\0') {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->value).
                 super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
         + 0x180) = _Var1;
        goto LAB_00419e5b;
      }
      lVar9 = lVar9 + 8;
    } while (sVar2 << 3 != lVar9);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
     + 0x180) = _Var1;
    this = local_1c0;
  }
  bVar8 = Type::isIntegral((this->super_AssignmentPatternExpressionBase).super_Expression.type.ptr);
  pLVar6 = local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pLVar5 = local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar4 = local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._24_4_ = ZEXT14(!bVar8);
  *(pointer *)
   &(__return_storage_ptr__->value).
    super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
       = pLVar4;
  *(pointer *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 8) = pLVar5;
  *(pointer *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 0x10) = pLVar6;
  local_1b8._16_8_ = 0;
  local_1b8._0_8_ = 0;
  local_1b8._8_8_ = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 0x18) = local_1b8._24_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 0x180) = '\x02';
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::~vector
            ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)&local_1b8);
LAB_00419e5b:
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::~vector(&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

LValue SimpleAssignmentPatternExpression::evalLValueImpl(EvalContext& context) const {
    std::vector<LValue> lvals;
    lvals.reserve(elements().size());
    for (auto elem : elements()) {
        LValue lval = elem->as<AssignmentExpression>().left().evalLValue(context);
        if (!lval)
            return nullptr;

        lvals.emplace_back(std::move(lval));
    }

    auto lvalKind = type->isIntegral() ? LValue::Concat::Packed : LValue::Concat::Unpacked;
    return LValue(std::move(lvals), lvalKind);
}